

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderDepthRangeTest::init(ShaderDepthRangeTest *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  string *ctx_00;
  char *local_210;
  bool local_1e2;
  allocator<char> local_1e1;
  string local_1e0 [38];
  byte local_1ba;
  allocator<char> local_1b9;
  string local_1b8 [48];
  ostringstream local_188 [8];
  ostringstream src;
  ShaderDepthRangeTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"#version 300 es\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    std::operator<<((ostream *)local_188,"layout(location = 0) out mediump vec4 o_color;\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_188,"in highp vec4 a_position;\n");
    std::operator<<(poVar3,"out mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)local_188,"void main (void)\n{\n");
  poVar3 = std::operator<<((ostream *)local_188,"\t");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_210 = "o_color";
  }
  else {
    local_210 = "v_color";
  }
  poVar3 = std::operator<<(poVar3,local_210);
  std::operator<<(poVar3,
                  " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n"
                 );
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    std::operator<<((ostream *)local_188,"\tgl_Position = a_position;\n");
  }
  std::operator<<((ostream *)local_188,"}\n");
  pcVar1 = init::defaultVertSrc;
  local_1ba = 0;
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1ba = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_1b8,pcVar1,&local_1b9);
  }
  else {
    std::__cxx11::ostringstream::str();
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  if ((local_1ba & 1) != 0) {
    std::allocator<char>::~allocator(&local_1b9);
  }
  pcVar1 = init::defaultFragSrc;
  local_1e2 = ((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0;
  if (local_1e2) {
    std::__cxx11::ostringstream::str();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1e0,pcVar1,&local_1e1);
  }
  local_1e2 = !local_1e2;
  ctx_00 = local_1e0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,ctx_00);
  std::__cxx11::string::~string(local_1e0);
  if (local_1e2) {
    std::allocator<char>::~allocator(&local_1e1);
  }
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  iVar2 = std::__cxx11::ostringstream::~ostringstream(local_188);
  return iVar2;
}

Assistant:

void init (void)
	{
		static const char* defaultVertSrc =
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n";
		static const char* defaultFragSrc =
			"#version 300 es\n"
			"in mediump vec4 v_color;\n"
			"layout(location = 0) out mediump vec4 o_color;\n\n"
			"void main (void)\n"
			"{\n"
			"	o_color = v_color;\n"
			"}\n";

		// Construct shader.
		std::ostringstream src;
		src << "#version 300 es\n";
		if (m_isVertexCase)
			src << "in highp vec4 a_position;\n"
				<< "out mediump vec4 v_color;\n";
		else
			src << "layout(location = 0) out mediump vec4 o_color;\n";

		src << "void main (void)\n{\n";
		src << "\t" << (m_isVertexCase ? "v_color" : "o_color") << " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n";

		if (m_isVertexCase)
			src << "\tgl_Position = a_position;\n";

		src << "}\n";

		m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
		m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

		gls::ShaderRenderCase::init();
	}